

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

bool __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::
can_be_inserted(storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>
                *this,size_t hash,double value)

{
  double dVar1;
  pointer prVar2;
  long lVar3;
  bool bVar4;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  bVar4 = true;
  if ((ulong)(uint)this->m_size != 0) {
    prVar2 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      if (*(int *)((long)&prVar2->remaining_constraints + lVar3) == 0) {
        dVar1 = *(double *)((long)&prVar2->value + lVar3);
        if (((dVar1 == value) && (!NAN(dVar1) && !NAN(value))) &&
           (*(size_t *)((long)&prVar2->hash + lVar3) == hash)) {
          bVar4 = false;
          break;
        }
      }
      lVar3 = lVar3 + 0x38;
    } while ((ulong)(uint)this->m_size * 0x38 - lVar3 != 0);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return bVar4;
}

Assistant:

bool can_be_inserted([[maybe_unused]] const std::size_t hash,
                         const double value) const noexcept
    {
        m_indices_reader lock(m_indices_mutex);

        for (int i = 0; i != m_size; ++i)
            if (m_data[i].remaining_constraints == 0 &&
                m_data[i].value == value && m_data[i].hash == hash)
                return false;

        return true;
    }